

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::remove_prefix::test_method(remove_prefix *this)

{
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view prefix_02;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view prefix_03;
  string_view prefix_04;
  string_view prefix_05;
  string_view prefix_06;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  bool bVar1;
  long in_FS_OFFSET;
  string_view sVar2;
  char *in_stack_fffffffffffff928;
  lazy_ostream *in_stack_fffffffffffff930;
  char *in_stack_fffffffffffff938;
  char *in_stack_fffffffffffff940;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff948;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  const_string *in_stack_fffffffffffff950;
  const_string *msg;
  char *in_stack_fffffffffffff958;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffff960;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff968;
  char *this_01;
  size_t in_stack_fffffffffffff990;
  undefined1 *puVar3;
  char *in_stack_fffffffffffff998;
  char *pcVar4;
  size_t in_stack_fffffffffffff9a0;
  char *pcVar5;
  char *in_stack_fffffffffffff9a8;
  char *pcVar6;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [32];
  const_string local_488;
  undefined1 local_478 [48];
  string_view local_448;
  undefined1 local_438 [16];
  undefined1 local_428 [32];
  char local_408 [16];
  undefined1 local_3f8 [48];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [96];
  string_view local_358;
  undefined1 local_348 [16];
  undefined1 local_338 [96];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [96];
  string_view local_268;
  undefined1 local_258 [16];
  undefined1 local_248 [96];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [96];
  string_view local_178;
  undefined1 local_168 [16];
  undefined1 local_158 [96];
  undefined1 local_f8 [16];
  undefined1 local_e8 [64];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958
               ,in_stack_fffffffffffff950);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    str_03._M_str = in_stack_fffffffffffff9a8;
    str_03._M_len = in_stack_fffffffffffff9a0;
    sVar2._M_str = in_stack_fffffffffffff998;
    sVar2._M_len = in_stack_fffffffffffff990;
    util::RemovePrefix_abi_cxx11_(str_03,sVar2);
    in_stack_fffffffffffff938 = "\"common/system.h\"";
    in_stack_fffffffffffff930 = (lazy_ostream *)0x1cd1f4f;
    in_stack_fffffffffffff928 = "RemovePrefix(\"./common/system.h\", \"./\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
              (local_e8,local_f8,0x6aa,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff928);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958
               ,in_stack_fffffffffffff950);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    str._M_str = (char *)in_stack_fffffffffffff968;
    str._M_len = (size_t)in_stack_fffffffffffff960;
    prefix._M_str = in_stack_fffffffffffff958;
    prefix._M_len = (size_t)in_stack_fffffffffffff950;
    sVar2 = util::RemovePrefixView(str,prefix);
    in_stack_fffffffffffff938 = "\"\"";
    in_stack_fffffffffffff930 = (lazy_ostream *)0x1ccada1;
    in_stack_fffffffffffff928 = "RemovePrefixView(\"foo\", \"foo\")";
    local_178 = sVar2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[1]>
              (local_158,local_168,0x6ab,1,2,&local_178);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958
               ,in_stack_fffffffffffff950);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    str_04._M_str = in_stack_fffffffffffff9a8;
    str_04._M_len = in_stack_fffffffffffff9a0;
    prefix_03._M_str = in_stack_fffffffffffff998;
    prefix_03._M_len = in_stack_fffffffffffff990;
    util::RemovePrefix_abi_cxx11_(str_04,prefix_03);
    in_stack_fffffffffffff938 = "\"o\"";
    in_stack_fffffffffffff930 = (lazy_ostream *)0x1e9e080;
    in_stack_fffffffffffff928 = "RemovePrefix(\"foo\", \"fo\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_1d8,local_1e8,0x6ac,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff928);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958
               ,in_stack_fffffffffffff950);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    str_00._M_str = (char *)in_stack_fffffffffffff968;
    str_00._M_len = (size_t)in_stack_fffffffffffff960;
    prefix_00._M_str = in_stack_fffffffffffff958;
    prefix_00._M_len = (size_t)in_stack_fffffffffffff950;
    sVar2 = util::RemovePrefixView(str_00,prefix_00);
    in_stack_fffffffffffff938 = "\"oo\"";
    in_stack_fffffffffffff930 = (lazy_ostream *)0x1c9fa63;
    in_stack_fffffffffffff928 = "RemovePrefixView(\"foo\", \"f\")";
    local_268 = sVar2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[3]>
              (local_248,local_258,0x6ad,1,2,&local_268);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958
               ,in_stack_fffffffffffff950);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    str_05._M_str = in_stack_fffffffffffff9a8;
    str_05._M_len = in_stack_fffffffffffff9a0;
    prefix_04._M_str = in_stack_fffffffffffff998;
    prefix_04._M_len = in_stack_fffffffffffff990;
    util::RemovePrefix_abi_cxx11_(str_05,prefix_04);
    in_stack_fffffffffffff938 = "\"foo\"";
    in_stack_fffffffffffff930 = (lazy_ostream *)0x1cd0f54;
    in_stack_fffffffffffff928 = "RemovePrefix(\"foo\", \"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_2c8,local_2d8,0x6ae,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff928);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958
               ,in_stack_fffffffffffff950);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    str_01._M_str = (char *)in_stack_fffffffffffff968;
    str_01._M_len = (size_t)in_stack_fffffffffffff960;
    prefix_01._M_str = in_stack_fffffffffffff958;
    prefix_01._M_len = (size_t)in_stack_fffffffffffff950;
    sVar2 = util::RemovePrefixView(str_01,prefix_01);
    in_stack_fffffffffffff938 = "\"fo\"";
    in_stack_fffffffffffff930 = (lazy_ostream *)0x1bf3896;
    in_stack_fffffffffffff928 = "RemovePrefixView(\"fo\", \"foo\")";
    local_358 = sVar2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[3]>
              (local_338,local_348,0x6af,1,2,&local_358);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958
               ,in_stack_fffffffffffff950);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    str_06._M_str = in_stack_fffffffffffff9a8;
    str_06._M_len = in_stack_fffffffffffff9a0;
    prefix_05._M_str = in_stack_fffffffffffff998;
    prefix_05._M_len = in_stack_fffffffffffff990;
    util::RemovePrefix_abi_cxx11_(str_06,prefix_05);
    in_stack_fffffffffffff938 = "\"f\"";
    in_stack_fffffffffffff930 = (lazy_ostream *)0x1cca032;
    in_stack_fffffffffffff928 = "RemovePrefix(\"f\", \"foo\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
              (local_3b8,local_3c8,0x6b0,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff928);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar5 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    puVar3 = local_3f8;
    pcVar6 = (char *)0x63;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    pcVar4 = local_408;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff968,in_stack_fffffffffffff960,(size_t)in_stack_fffffffffffff958
               ,in_stack_fffffffffffff950);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    str_02._M_str = (char *)in_stack_fffffffffffff968;
    str_02._M_len = (size_t)in_stack_fffffffffffff960;
    prefix_02._M_str = in_stack_fffffffffffff958;
    prefix_02._M_len = (size_t)in_stack_fffffffffffff950;
    sVar2 = util::RemovePrefixView(str_02,prefix_02);
    in_stack_fffffffffffff938 = "\"\"";
    in_stack_fffffffffffff930 = (lazy_ostream *)0x1ccada1;
    in_stack_fffffffffffff928 = "RemovePrefixView(\"\", \"foo\")";
    local_448 = sVar2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[1]>
              (local_428,local_438,0x6b1,1,2,&local_448);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_01 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    line_num = local_478;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    file = &local_488;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff930,(char (*) [1])in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)in_stack_fffffffffffff930,(unsigned_long)in_stack_fffffffffffff928);
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)0x1ccada1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)0x1ccada1,
               in_stack_fffffffffffff940);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,in_stack_fffffffffffff940);
    str_07._M_str = pcVar6;
    str_07._M_len = (size_t)pcVar5;
    prefix_06._M_str = pcVar4;
    prefix_06._M_len = (size_t)puVar3;
    util::RemovePrefix_abi_cxx11_(str_07,prefix_06);
    in_stack_fffffffffffff938 = "\"\"";
    in_stack_fffffffffffff930 = (lazy_ostream *)0x1ccada1;
    in_stack_fffffffffffff928 = "RemovePrefix(\"\", \"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_4a8,local_4b8,0x6b2,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff928);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(remove_prefix)
{
    BOOST_CHECK_EQUAL(RemovePrefix("./common/system.h", "./"), "common/system.h");
    BOOST_CHECK_EQUAL(RemovePrefixView("foo", "foo"), "");
    BOOST_CHECK_EQUAL(RemovePrefix("foo", "fo"), "o");
    BOOST_CHECK_EQUAL(RemovePrefixView("foo", "f"), "oo");
    BOOST_CHECK_EQUAL(RemovePrefix("foo", ""), "foo");
    BOOST_CHECK_EQUAL(RemovePrefixView("fo", "foo"), "fo");
    BOOST_CHECK_EQUAL(RemovePrefix("f", "foo"), "f");
    BOOST_CHECK_EQUAL(RemovePrefixView("", "foo"), "");
    BOOST_CHECK_EQUAL(RemovePrefix("", ""), "");
}